

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob.h
# Opt level: O0

void __thiscall ncnn::Blob::~Blob(Blob *this)

{
  int iVar1;
  int *piVar2;
  string *psVar3;
  string *in_RDI;
  
  psVar3 = in_RDI + 0x28;
  if (*(long *)(in_RDI + 0x30) != 0) {
    piVar2 = *(int **)(in_RDI + 0x30);
    LOCK();
    iVar1 = *piVar2;
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (iVar1 == 1) {
      if (*(long *)(in_RDI + 0x48) == 0) {
        if (*(void **)psVar3 != (void *)0x0) {
          free(*(void **)psVar3);
        }
      }
      else {
        (**(code **)(**(long **)(in_RDI + 0x48) + 0x18))
                  (*(long **)(in_RDI + 0x48),*(undefined8 *)psVar3);
      }
    }
  }
  *(undefined8 *)psVar3 = 0;
  *(undefined8 *)(in_RDI + 0x38) = 0;
  *(undefined4 *)(in_RDI + 0x40) = 0;
  *(undefined4 *)(in_RDI + 0x50) = 0;
  *(undefined4 *)(in_RDI + 0x54) = 0;
  *(undefined4 *)(in_RDI + 0x58) = 0;
  *(undefined4 *)(in_RDI + 0x5c) = 0;
  *(undefined4 *)(in_RDI + 0x60) = 0;
  *(undefined8 *)(in_RDI + 0x68) = 0;
  *(undefined8 *)(in_RDI + 0x30) = 0;
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

class NCNN_EXPORT Blob
{
public:
    // empty
    Blob();

public:
#if NCNN_STRING
    // blob name
    std::string name;
#endif // NCNN_STRING
    // layer index which produce this blob as output
    int producer;
    // layer index which need this blob as input
    int consumer;
    // shape hint
    Mat shape;
}